

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall
MPLSParser::parseSubPathEntryExtension(MPLSParser *this,uint8_t *data,uint32_t dataLen)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int i;
  long lVar6;
  char clip_Information_file_name [6];
  BitStreamReader reader;
  char local_5a [5];
  char local_55;
  uint local_54;
  BitStreamReader local_50;
  
  local_50.super_BitStream.m_totalBits = 0;
  local_50.super_BitStream.m_buffer = (uint *)0x0;
  local_50.super_BitStream.m_initBuffer = (uint *)0x0;
  local_50.m_curVal = 0;
  local_50.m_bitLeft = 0;
  BitStream::setBuffer(&local_50.super_BitStream,data,data + dataLen);
  local_50._24_8_ = local_50._24_8_ & 0xffffffff;
  local_50.m_curVal = BitStreamReader::getCurVal(&local_50,local_50.super_BitStream.m_buffer);
  local_50.m_bitLeft = 0x20;
  BitStreamReader::skipBits(&local_50,0x20);
  uVar2 = BitStreamReader::getBits(&local_50,0x10);
  if ((short)uVar2 != 0) {
    BitStreamReader::skipBits(&local_50,0x20);
    BitStreamReader::skipBits(&local_50,8);
    uVar2 = BitStreamReader::getBits(&local_50,8);
    if ((uVar2 & 0xfe) == 8) {
      BitStreamReader::skipBits(&local_50,0x18);
      local_54 = BitStreamReader::getBits(&local_50,8);
      local_54 = local_54 & 0xff;
      if (local_54 != 0) {
        uVar2 = 0;
        do {
          BitStreamReader::skipBits(&local_50,0x10);
          lVar6 = 0;
          do {
            uVar3 = BitStreamReader::getBits(&local_50,8);
            local_5a[lVar6] = (char)uVar3;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 5);
          local_55 = '\0';
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char(&)[6]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->m_mvcFiles,(char (*) [6])local_5a);
          BitStreamReader::skipBits(&local_50,0x20);
          BitStreamReader::skipBits(&local_50,0x1f);
          bVar1 = BitStreamReader::getBit(&local_50);
          BitStreamReader::skipBits(&local_50,8);
          BitStreamReader::skipBits(&local_50,0x20);
          BitStreamReader::skipBits(&local_50,0x20);
          BitStreamReader::skipBits(&local_50,0x10);
          BitStreamReader::skipBits(&local_50,0x20);
          if (bVar1) {
            uVar3 = BitStreamReader::getBits(&local_50,8);
            BitStreamReader::skipBits(&local_50,8);
            if (1 < (uVar3 & 0xff)) {
              uVar5 = 1;
              do {
                lVar6 = 0;
                do {
                  uVar4 = BitStreamReader::getBits(&local_50,8);
                  local_5a[lVar6] = (char)uVar4;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 5);
                local_55 = '\0';
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char(&)[6]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &this->m_mvcFiles,(char (*) [6])local_5a);
                BitStreamReader::skipBits(&local_50,0x20);
                BitStreamReader::skipBits(&local_50,8);
                uVar5 = uVar5 + 1;
              } while (uVar5 != (uVar3 & 0xff));
            }
          }
          uVar2 = uVar2 + 1;
        } while (uVar2 != local_54);
      }
    }
  }
  return;
}

Assistant:

void MPLSParser::parseSubPathEntryExtension(uint8_t* data, const uint32_t dataLen)
{
    BitStreamReader reader{};
    reader.setBuffer(data, data + dataLen);
    try
    {
        reader.skipBits(32);  // length
        const auto size = reader.getBits<uint16_t>(16);
        // for (int i = 0; i < size; ++i)
        if (size > 0)
        {
            // subpath extension
            reader.skipBits(32);  // length
            reader.skipBits(8);   // reserved field
            const auto type = reader.getBits<uint8_t>(8);
            if (type == 8 || type == 9)
            {
                reader.skipBits(24);
                const auto subPlayItems = reader.getBits<uint8_t>(8);
                for (int i = 0; i < subPlayItems; ++i)
                {
                    reader.skipBits(16);
                    char clip_Information_file_name[6];
                    CLPIStreamInfo::readString(clip_Information_file_name, reader, 5);
                    m_mvcFiles.emplace_back(clip_Information_file_name);
                    reader.skipBits(32);  // clip codec identifier
                    reader.skipBits(31);  // reserved, condition
                    const bool isMulticlip = reader.getBit();
                    reader.skipBits(8);   // ref to stc id
                    reader.skipBits(32);  // in time
                    reader.skipBits(32);  // out time
                    reader.skipBits(16);  // sync play item id
                    reader.skipBits(32);  // sync start
                    if (isMulticlip)
                    {
                        const auto numberOfClipEntries = reader.getBits<uint8_t>(8);
                        reader.skipBits(8);  // reserved
                        for (int j = 1; j < numberOfClipEntries; ++j)
                        {
                            CLPIStreamInfo::readString(clip_Information_file_name, reader, 5);
                            m_mvcFiles.emplace_back(clip_Information_file_name);
                            reader.skipBits(32);  // clip codec identifier
                            reader.skipBits(8);   // ref to stc id
                        }
                    }
                }
            }
        }
    }
    catch (...)
    {
    }
}